

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTextLiteralWithExtent::~IfcTextLiteralWithExtent
          (IfcTextLiteralWithExtent *this)

{
  _func_int *p_Var1;
  long *plVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.
                   super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  plVar2 = (long *)((this->BoxAlignment).field_2._M_local_buf + (long)p_Var3);
  plVar2[-0x15] = 0x80d2f0;
  plVar2[2] = 0x80d390;
  plVar2[-0x13] = 0x80d318;
  plVar2[-0x11] = 0x80d340;
  plVar2[-5] = 0x80d368;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *(undefined8 *)p_Var1 = 0x80d468;
  *(undefined8 *)(p_Var1 + 0xb8) = 0x80d4e0;
  *(undefined8 *)(p_Var1 + 0x10) = 0x80d490;
  *(undefined8 *)(p_Var1 + 0x20) = 0x80d4b8;
  if (*(code **)(p_Var1 + 0x60) != p_Var1 + 0x70) {
    operator_delete(*(code **)(p_Var1 + 0x60),*(long *)(p_Var1 + 0x70) + 1);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x58) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x58));
  }
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30),*(long *)(p_Var1 + 0x40) + 1);
  }
  operator_delete(p_Var1,0xd0);
  return;
}

Assistant:

IfcTextLiteralWithExtent() : Object("IfcTextLiteralWithExtent") {}